

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall
bssl::
InplaceVector<bssl::(anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::NoSelfMove,8ul>
::EraseIf<bssl::(anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::__7>
          (InplaceVector<bssl::(anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::NoSelfMove,8ul>
           *this)

{
  bool bVar1;
  NoSelfMove *pNVar2;
  NoSelfMove *pNVar3;
  size_t sVar4;
  ulong local_38;
  size_t i;
  size_t new_size;
  NoSelfMove *iter;
  InplaceVector<NoSelfMove,_8UL> *this_local;
  
  pNVar2 = InplaceVector<NoSelfMove,_8UL>::begin((InplaceVector<NoSelfMove,_8UL> *)this);
  pNVar3 = InplaceVector<NoSelfMove,_8UL>::end((InplaceVector<NoSelfMove,_8UL> *)this);
  pNVar2 = std::
           find_if<bssl::(anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::NoSelfMove*,bssl::(anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::__7>
                     (pNVar2,pNVar3);
  pNVar3 = InplaceVector<NoSelfMove,_8UL>::end((InplaceVector<NoSelfMove,_8UL> *)this);
  if (pNVar2 != pNVar3) {
    pNVar3 = InplaceVector<NoSelfMove,_8UL>::begin((InplaceVector<NoSelfMove,_8UL> *)this);
    i = (long)pNVar2 - (long)pNVar3 >> 3;
    local_38 = i;
    while( true ) {
      local_38 = local_38 + 1;
      sVar4 = InplaceVector<NoSelfMove,_8UL>::size((InplaceVector<NoSelfMove,_8UL> *)this);
      if (sVar4 <= local_38) break;
      pNVar2 = InplaceVector<NoSelfMove,_8UL>::operator[]
                         ((InplaceVector<NoSelfMove,_8UL> *)this,local_38);
      bVar1 = (anonymous_namespace)::InplaceVectorTest_EraseIf_Test::TestBody()::$_7::operator()
                        ((__7 *)((long)&this_local + 7),pNVar2);
      if (!bVar1) {
        pNVar2 = InplaceVector<NoSelfMove,_8UL>::operator[]
                           ((InplaceVector<NoSelfMove,_8UL> *)this,local_38);
        pNVar3 = InplaceVector<NoSelfMove,_8UL>::operator[]
                           ((InplaceVector<NoSelfMove,_8UL> *)this,i);
        anon_unknown_0::InplaceVectorTest_EraseIf_Test::TestBody::NoSelfMove::operator=
                  (pNVar3,pNVar2);
        i = i + 1;
      }
    }
    InplaceVector<NoSelfMove,_8UL>::Shrink((InplaceVector<NoSelfMove,_8UL> *)this,i);
  }
  return;
}

Assistant:

void EraseIf(Pred pred) {
    // See if anything needs to be erased at all. This avoids a self-move.
    auto iter = std::find_if(begin(), end(), pred);
    if (iter == end()) {
      return;
    }

    // Elements before the first to be erased may be left as-is.
    size_t new_size = iter - begin();
    // Swap all subsequent elements in if they are to be kept.
    for (size_t i = new_size + 1; i < size(); i++) {
      if (!pred((*this)[i])) {
        (*this)[new_size] = std::move((*this)[i]);
        new_size++;
      }
    }

    Shrink(new_size);
  }